

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

void __thiscall spirv_cross::ParsedIR::set_id_bounds(ParsedIR *this,uint32_t bounds)

{
  _Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false> _Var1;
  Variant *pVVar2;
  size_t sVar3;
  ulong uVar4;
  ulong count;
  
  count = (ulong)bounds;
  SmallVector<spirv_cross::Variant,_8UL>::reserve(&this->ids,count);
  uVar4 = (this->ids).super_VectorView<spirv_cross::Variant>.buffer_size;
  while (uVar4 < count) {
    _Var1._M_head_impl =
         (this->pool_group)._M_t.
         super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
         ._M_t.
         super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
         .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    SmallVector<spirv_cross::Variant,_8UL>::reserve(&this->ids,uVar4 + 1);
    pVVar2 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr;
    sVar3 = (this->ids).super_VectorView<spirv_cross::Variant>.buffer_size;
    pVVar2[sVar3].group = _Var1._M_head_impl;
    pVVar2[sVar3].holder = (IVariant *)0x0;
    pVVar2[sVar3].type = TypeNone;
    pVVar2[sVar3].allow_type_rewrite = false;
    uVar4 = sVar3 + 1;
    (this->ids).super_VectorView<spirv_cross::Variant>.buffer_size = uVar4;
  }
  SmallVector<unsigned_char,_8UL>::resize(&this->block_meta,count);
  return;
}

Assistant:

void ParsedIR::set_id_bounds(uint32_t bounds)
{
	ids.reserve(bounds);
	while (ids.size() < bounds)
		ids.emplace_back(pool_group.get());

	block_meta.resize(bounds);
}